

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_tests.cpp
# Opt level: O3

void move_value_test(void)

{
  putchar(10);
  printf("move_value_test");
  putchar(10);
  puts("=> Passed: status_code == 0");
  puts("=> Passed: data[0] == 0");
  puts("=> Passed: data[1] == 0");
  puts("=> Passed: data[2] == 100");
  puts("=> Passed: status_code == 0");
  puts("=> Passed: data[0] == 0");
  puts("=> Passed: data[1] == 0");
  puts("=> Passed: data[2] == 100");
  puts("=> Passed: data[3] == 201");
  return;
}

Assistant:

void move_value_test() {
    LIBBRAIN_TEST

    auto* data = BRAIN_ALLOC_TAPE(10000);
    data[0] = 100;
    data[2] = 76;

    // BF Program which moves the value in one index to one 2 indicies over, overwriting the thing 2 cells over
    BRAIN_PROGRAM move_program = BRAIN_COMPILE(>>[-]<<[->>+<<]);
    int status_code = move_program.exec(data, 0);

    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)

    data[1] = 201;

    status_code = move_program.exec(data, 1);
    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)
    LIBBRAIN_ASSERT(data[3], 201)

    delete[] data;
}